

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

pseudo_t dmrC_insert_phi_node(dmr_C *C,basic_block *bb,symbol *type)

{
  uint uVar1;
  symbol *newitem;
  pseudo_t ppVar2;
  uint *puVar3;
  int iVar4;
  undefined1 local_58 [8];
  ptr_list_iter insniter__;
  
  newitem = (symbol *)alloc_typed_instruction(C,0x2e,type);
  ppVar2 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar2->type = PSEUDO_REG;
  iVar4 = C->L->nr + 1;
  C->L->nr = iVar4;
  ppVar2->nr = iVar4;
  (ppVar2->field_5).sym = newitem;
  ((anon_union_8_2_14638a90_for_instruction_5 *)&newitem->next_id)->target = ppVar2;
  *(basic_block **)&(newitem->pos).field_0x4 = bb;
  insniter__._16_8_ = C;
  ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->insns);
  do {
    puVar3 = (uint *)ptrlist_iter_next((ptr_list_iter *)local_58);
    if (puVar3 == (uint *)0x0) break;
    uVar1 = *puVar3;
    if (((char)uVar1 != '\x01') && ((uVar1 & 0xff) != 0x2e)) {
      ptrlist_iter_insert((ptr_list_iter *)local_58,newitem);
    }
  } while (((char)uVar1 == '.') || ((uVar1 & 0xff) == 1));
  if (puVar3 == (uint *)0x0) {
    ptrlist_add((ptr_list **)&bb->insns,newitem,(allocator *)(insniter__._16_8_ + 0x30));
  }
  return ppVar2;
}

Assistant:

pseudo_t dmrC_insert_phi_node(struct dmr_C *C, struct basic_block *bb, struct symbol *type)
{
	struct instruction *phi_node = alloc_typed_instruction(C, OP_PHI, type);
	struct instruction *insn;
	pseudo_t phi;

	phi = dmrC_alloc_pseudo(C, phi_node);
	phi_node->target = phi;
	phi_node->bb = bb;

	FOR_EACH_PTR(bb->insns, insn) {
		enum opcode op = insn->opcode;
		if (op == OP_ENTRY || op == OP_PHI)
			continue;
		INSERT_CURRENT(phi_node, insn);
		return phi;
	} END_FOR_EACH_PTR(insn);

	dmrC_add_instruction(C, &bb->insns, phi_node);
	return phi;
}